

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void CaDiCaL::Options::initialize_from_environment(int *val,char *name,int L,int H)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  char *val_str;
  long lVar4;
  char key [80];
  char local_88 [88];
  
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    local_88[lVar4] = "CADICAL_"[lVar4];
  }
  lVar4 = 0;
  while( true ) {
    if (name[lVar4] == '\0') break;
    iVar3 = toupper((int)name[lVar4]);
    local_88[lVar4 + 8] = (char)iVar3;
    lVar4 = lVar4 + 1;
  }
  local_88[lVar4 + 8] = '\0';
  val_str = getenv(local_88);
  if (val_str != (char *)0x0) {
    bVar2 = parse_int_str(val_str,val);
    if (bVar2) {
      iVar3 = *val;
      iVar1 = L;
      if (L < iVar3) {
        iVar1 = iVar3;
      }
      if (iVar3 < L || H < iVar1) {
        if (iVar1 < H) {
          H = iVar1;
        }
        *val = H;
      }
    }
  }
  return;
}

Assistant:

void Options::initialize_from_environment (int &val, const char *name,
                                           const int L, const int H) {
  char key[80], *q;
  const char *p;
  assert (strlen (name) + strlen ("CADICAL_") + 1 < sizeof (key));
  for (p = "CADICAL_", q = key; *p; p++)
    *q++ = *p;
  for (p = name; *p; p++)
    *q++ = toupper (*p);
  assert (q < key + sizeof (key));
  *q = 0;
  const char *val_str = getenv (key);
  if (!val_str)
    return;
  if (!parse_int_str (val_str, val))
    return;
  if (val < L)
    val = L;
  if (val > H)
    val = H;
}